

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

void __thiscall duckdb::BaseStatistics::Copy(BaseStatistics *this,BaseStatistics *other)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  StatisticsType SVar4;
  
  this->has_null = other->has_null;
  this->has_no_null = other->has_no_null;
  this->distinct_count = other->distinct_count;
  uVar1 = *(undefined8 *)((long)&other->stats_union + 8);
  uVar2 = *(undefined8 *)((long)&other->stats_union + 0x10);
  uVar3 = *(undefined8 *)((long)&other->stats_union + 0x18);
  *(undefined8 *)(this->stats_union).string_data.min =
       *(undefined8 *)(other->stats_union).string_data.min;
  *(undefined8 *)((long)&this->stats_union + 8) = uVar1;
  *(undefined8 *)((long)&this->stats_union + 0x10) = uVar2;
  *(undefined8 *)((long)&this->stats_union + 0x18) = uVar3;
  *(undefined8 *)((long)&this->stats_union + 0x20) =
       *(undefined8 *)((long)&other->stats_union + 0x20);
  SVar4 = GetStatsType(&this->type);
  if (SVar4 == ARRAY_STATS) {
    ArrayStats::Copy(this,other);
    return;
  }
  if (SVar4 != STRUCT_STATS) {
    if (SVar4 == LIST_STATS) {
      ListStats::Copy(this,other);
      return;
    }
    return;
  }
  StructStats::Copy(this,other);
  return;
}

Assistant:

void BaseStatistics::Copy(const BaseStatistics &other) {
	D_ASSERT(GetType() == other.GetType());
	CopyBase(other);
	stats_union = other.stats_union;
	switch (GetStatsType()) {
	case StatisticsType::LIST_STATS:
		ListStats::Copy(*this, other);
		break;
	case StatisticsType::STRUCT_STATS:
		StructStats::Copy(*this, other);
		break;
	case StatisticsType::ARRAY_STATS:
		ArrayStats::Copy(*this, other);
		break;
	default:
		break;
	}
}